

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O3

string * __thiscall
google::protobuf::internal::ArenaStringPtr::ReleaseNonDefault
          (ArenaStringPtr *this,string *default_value,Arena *arena)

{
  string *psVar1;
  
  if (arena == (Arena *)0x0) {
    psVar1 = (string *)(this->tagged_ptr_).ptr_;
  }
  else {
    psVar1 = (string *)operator_new(0x20);
    (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
    psVar1->_M_string_length = 0;
    (psVar1->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::swap((string *)psVar1);
  }
  (this->tagged_ptr_).ptr_ = default_value;
  return psVar1;
}

Assistant:

std::string* ArenaStringPtr::ReleaseNonDefault(const std::string* default_value,
                                               ::google::protobuf::Arena* arena) {
  GOOGLE_DCHECK(!IsDefault(default_value));

  if (!IsDonatedString()) {
    std::string* released;
    if (arena != nullptr) {
      released = new std::string;
      released->swap(*UnsafeMutablePointer());
    } else {
      released = UnsafeMutablePointer();
    }
    tagged_ptr_.Set(const_cast<std::string*>(default_value));
    return released;
  } else /* IsDonatedString() */ {
    GOOGLE_DCHECK(arena != nullptr);
    std::string* released = new std::string(Get());
    tagged_ptr_.Set(const_cast<std::string*>(default_value));
    return released;
  }
}